

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conjunction_filter.cpp
# Opt level: O2

FilterPropagateResult __thiscall
duckdb::ConjunctionAndFilter::CheckStatistics(ConjunctionAndFilter *this,BaseStatistics *stats)

{
  pointer puVar1;
  int iVar2;
  pointer pTVar3;
  FilterPropagateResult FVar4;
  unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true> *filter;
  pointer this_00;
  
  this_00 = (this->super_ConjunctionFilter).child_filters.
            super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->super_ConjunctionFilter).child_filters.
           super_vector<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  FVar4 = FILTER_ALWAYS_TRUE;
  while( true ) {
    if (this_00 == puVar1) {
      return FVar4;
    }
    pTVar3 = unique_ptr<duckdb::TableFilter,_std::default_delete<duckdb::TableFilter>,_true>::
             operator->(this_00);
    iVar2 = (*pTVar3->_vptr_TableFilter[2])(pTVar3,stats);
    if ((FilterPropagateResult)iVar2 == FILTER_ALWAYS_FALSE) break;
    if ((FilterPropagateResult)iVar2 != FVar4) {
      FVar4 = NO_PRUNING_POSSIBLE;
    }
    this_00 = this_00 + 1;
  }
  return FILTER_ALWAYS_FALSE;
}

Assistant:

FilterPropagateResult ConjunctionAndFilter::CheckStatistics(BaseStatistics &stats) {
	// the AND filter is true if ALL of the children is true
	D_ASSERT(!child_filters.empty());
	auto result = FilterPropagateResult::FILTER_ALWAYS_TRUE;
	for (auto &filter : child_filters) {
		auto prune_result = filter->CheckStatistics(stats);
		if (prune_result == FilterPropagateResult::FILTER_ALWAYS_FALSE) {
			return FilterPropagateResult::FILTER_ALWAYS_FALSE;
		} else if (prune_result != result) {
			result = FilterPropagateResult::NO_PRUNING_POSSIBLE;
		}
	}
	return result;
}